

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_Weave(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  AActor *self;
  bool bVar5;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003dcb2b;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self != (AActor *)0x0) {
        pPVar3 = (self->super_DThinker).super_DObject.Class;
        if (pPVar3 == (PClass *)0x0) {
          iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
          (self->super_DThinker).super_DObject.Class = pPVar3;
        }
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003dcb2b;
        }
        goto LAB_003dcaaa;
      }
    }
    else if (self != (AActor *)0x0) goto LAB_003dcb1b;
    self = (AActor *)0x0;
LAB_003dcaaa:
    if (numparam == 1) {
      pcVar4 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        if (numparam < 3) {
          pcVar4 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\0') {
            if (numparam == 3) {
              pcVar4 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\x01') {
                if ((uint)numparam < 5) {
                  pcVar4 = "(paramnum) < numparam";
                }
                else {
                  if (param[4].field_0.field_3.Type == '\x01') {
                    A_Weave(self,param[1].field_0.i,param[2].field_0.i,param[3].field_0.f,
                            param[4].field_0.f);
                    return 0;
                  }
                  pcVar4 = "param[paramnum].Type == REGT_FLOAT";
                }
                __assert_fail(pcVar4,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x1489,
                              "int AF_AActor_A_Weave(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              pcVar4 = "param[paramnum].Type == REGT_FLOAT";
            }
            __assert_fail(pcVar4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1488,
                          "int AF_AActor_A_Weave(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar4 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1487,
                      "int AF_AActor_A_Weave(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pcVar4 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1486,
                  "int AF_AActor_A_Weave(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003dcb1b:
  pcVar4 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003dcb2b:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1485,"int AF_AActor_A_Weave(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Weave)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT	(xspeed);
	PARAM_INT	(yspeed);
	PARAM_FLOAT	(xdist);
	PARAM_FLOAT	(ydist);
	A_Weave(self, xspeed, yspeed, xdist, ydist);
	return 0;
}